

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageTest::iterate(SwapBuffersWithDamageTest *this)

{
  int iVar1;
  EGLint numFrames;
  EGLint width;
  deUint32 dVar2;
  int iVar3;
  Library *egl;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  int in_R9D;
  uint uVar7;
  pointer frame;
  long lVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  long local_c8;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  Vec4 clearColor;
  vector<int,_std::allocator<int>_> damageRegion;
  FrameSequence frameSequence;
  Random rnd;
  
  deRandom_init(&rnd.m_rnd,this->m_seed);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  numFrames = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3057);
  width = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3056);
  fVar10 = deRandom_getFloat(&rnd.m_rnd);
  fVar11 = deRandom_getFloat(&rnd.m_rnd);
  clearColor.m_data[2] = deRandom_getFloat(&rnd.m_rnd);
  clearColor.m_data[3] = 1.0;
  clearColor.m_data[0] = fVar10;
  clearColor.m_data[1] = fVar11;
  generateFrameSequence
            (&frameSequence,&this->m_frameDrawType,(Random *)&rnd.m_rnd,numFrames,width,in_R9D);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3095);
  dVar2 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar2,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                   ,0x19b);
  iVar3 = width / 2;
  iVar1 = numFrames * 2;
  for (uVar7 = 0; (int)uVar7 < this->m_iterationTimes; uVar7 = uVar7 + 1) {
    local_c8 = 1;
    for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 1) {
      getDamageRegion(&damageRegion,
                      frameSequence.
                      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar6);
      clearColorScreen(&this->m_gl,&clearColor);
      frame = frameSequence.
              super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
              ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = local_c8;
      while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
        GLES2Renderer::render(this->m_gles2Renderer,numFrames,width,frame);
        frame = frame + 1;
      }
      if (this->m_resizeType == RESIZETYPE_BEFORE_SWAP) {
        if ((uVar7 & 1) == 0) {
          piVar5 = &local_a0;
          local_a0 = iVar1;
          local_9c = iVar3;
        }
        else {
          piVar5 = &local_a8;
          local_a8 = iVar3;
          local_a4 = iVar1;
        }
        (*this->m_window->_vptr_NativeWindow[6])(this->m_window,piVar5);
      }
      uVar4 = (ulong)((long)damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      (*egl->_vptr_Library[0x32])
                (egl,this->m_eglDisplay,this->m_eglSurface,
                 damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / 4 &
                 0xffffffff);
      dVar2 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar2,
                       "swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                       ,0x1af);
      if (this->m_resizeType == RESIZETYPE_AFTER_SWAP) {
        if ((uVar7 & 1) == 0) {
          piVar5 = &local_b0;
          local_b0 = iVar1;
          local_ac = iVar3;
        }
        else {
          piVar5 = &local_b8;
          local_b8 = iVar3;
          local_b4 = iVar1;
        }
        (*this->m_window->_vptr_NativeWindow[6])(this->m_window,piVar5);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&damageRegion.super__Vector_base<int,_std::allocator<int>_>);
      local_c8 = local_c8 + 1;
    }
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector(&frameSequence);
  return STOP;
}

Assistant:

TestCase::IterateResult SwapBuffersWithDamageTest::iterate (void)
{
	de::Random			rnd				(m_seed);
	const Library&		egl				= m_eglTestCtx.getLibrary();
	const int			width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int			height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float			clearRed		= rnd.getFloat();
	const float			clearGreen		= rnd.getFloat();
	const float			clearBlue		= rnd.getFloat();
	const tcu::Vec4		clearColor		(clearRed, clearGreen, clearBlue, 1.0f);
	const int			numFrames		= 24; // (width, height) = (480, 480) --> numFrame = 24, divisible
	const FrameSequence frameSequence	= generateFrameSequence(m_frameDrawType, rnd, numFrames, width, height);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int iterationNdx = 0; iterationNdx < m_iterationTimes; iterationNdx++)
	{
		for (int currentFrameNdx = 0; currentFrameNdx < numFrames; currentFrameNdx++)
		{
			vector<EGLint>	damageRegion = getDamageRegion(frameSequence[currentFrameNdx]);

			clearColorScreen(m_gl, clearColor);
			for (int ndx = 0; ndx <= currentFrameNdx; ndx++)
				m_gles2Renderer->render(width, height, frameSequence[ndx]);

			if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4));

			if (m_resizeType == RESIZETYPE_AFTER_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}
		}
	}
	return STOP;
}